

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void getFloat(char *attrName,int argc,char **argv,int *i,int part,SetAttrVector *attrs,
             _func_void_char_ptr_float *check)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Attribute *pAVar2;
  invalid_argument *this;
  double dVar3;
  allocator<char> local_7d;
  float local_7c;
  long *local_78;
  long local_70;
  long local_68 [2];
  SetAttr local_58;
  
  if (*i <= argc + -2) {
    dVar3 = strtod(argv[(long)*i + 1],(char **)0x0);
    local_7c = (float)dVar3;
    if (check != (_func_void_char_ptr_float *)0x0) {
      (*check)(attrName,local_7c);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,attrName,&local_7d);
    pAVar2 = (Attribute *)operator_new(0x10);
    Imf_3_2::TypedAttribute<float>::TypedAttribute((float *)pAVar2);
    paVar1 = &local_58.name.field_2;
    local_58.name._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,local_78,local_70 + (long)local_78);
    local_58.part = part;
    local_58.attr = pAVar2;
    std::vector<SetAttr,_std::allocator<SetAttr>_>::emplace_back<SetAttr>(attrs,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.name._M_dataplus._M_p != paVar1) {
      operator_delete(local_58.name._M_dataplus._M_p,local_58.name.field_2._M_allocated_capacity + 1
                     );
    }
    if (local_78 != local_68) {
      operator_delete(local_78,local_68[0] + 1);
    }
    *i = *i + 2;
    return;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"Expected a float");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void
getFloat (
    const char     attrName[],
    int            argc,
    char**         argv,
    int&           i,
    int            part,
    SetAttrVector& attrs,
    void (*check) (const char attrName[], float f) = 0)
{
    if (i > argc - 2)
        throw invalid_argument("Expected a float");

    float f = static_cast<float> (strtod (argv[i + 1], 0));

    if (check) check (attrName, f);

    attrs.push_back (SetAttr (attrName, part, new FloatAttribute (f)));
    i += 2;
}